

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

int Mvc_CoverGetCubeSize(Mvc_Cube_t *pCube)

{
  uint uVar1;
  uchar *puVar2;
  int nBits;
  int nBytes;
  int nOnes;
  uchar *pByteStop;
  uchar *pByteStart;
  uchar *pByte;
  Mvc_Cube_t *pCube_local;
  
  uVar1 = ((*(uint *)&pCube->field_0x8 & 0xffffff) + 1) * 0x20 -
          (*(uint *)&pCube->field_0x8 >> 0x18 & 0x3f);
  nBits = 0;
  pByteStart = (uchar *)pCube->pData;
  puVar2 = (uchar *)((long)pByteStart +
                    (long)(int)((int)((ulong)(long)(int)uVar1 >> 3) + (uint)((uVar1 & 7) != 0)));
  for (; pByteStart < puVar2; pByteStart = pByteStart + 1) {
    nBits = bit_count[*pByteStart] + nBits;
  }
  return nBits;
}

Assistant:

int Mvc_CoverGetCubeSize( Mvc_Cube_t * pCube )
{
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nOnes, nBytes, nBits;
    // get the number of unsigned chars in the cube's bit strings
    nBits = (pCube->iLast + 1) * sizeof(Mvc_CubeWord_t) * 8 - pCube->nUnused;
    nBytes = nBits / (8 * sizeof(unsigned char)) + (int)(nBits % (8 * sizeof(unsigned char)) > 0);
    // clean the counter of ones
    nOnes = 0;
    // set the starting and stopping positions
    pByteStart = (unsigned char *)pCube->pData;
    pByteStop  = pByteStart + nBytes;
    // iterate through the positions
    for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
        nOnes += bit_count[*pByte];
    return nOnes;
}